

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O2

void device_reset_scsp(void *info)

{
  undefined1 *puVar1;
  long lVar2;
  
  puVar1 = (undefined1 *)((long)info + 0x71);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    *(int *)(puVar1 + 0x6f) = (int)lVar2;
    *puVar1 = 0;
    *(undefined8 *)(puVar1 + 7) = 0;
    *(undefined4 *)(puVar1 + 0x1f) = 3;
    puVar1 = puVar1 + 0x98;
  }
  SCSPDSP_Init((SCSPDSP *)((long)info + 0x826a0));
  *(uint *)((long)info + 0x826a8) = *(uint *)((long)info + 0x1460) >> 1;
  *(undefined8 *)((long)info + 0x826a0) = *(undefined8 *)((long)info + 0x1458);
  return;
}

Assistant:

static void device_reset_scsp(void* info)
{
	scsp_state *scsp = (scsp_state *)info;
	int i;
	
	// make sure all the slots are off
	for(i=0;i<32;++i)
	{
		scsp->Slots[i].slot=i;
		scsp->Slots[i].active=0;
		scsp->Slots[i].base=NULL;
		scsp->Slots[i].EG.state=SCSP_RELEASE;
	}
	
	SCSPDSP_Init(&scsp->DSP);
	scsp->DSP.SCSPRAM_LENGTH = scsp->SCSPRAM_LENGTH / 2;
	scsp->DSP.SCSPRAM = (UINT16*)scsp->SCSPRAM;
	
	return;
}